

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O2

void __thiscall
DTextEnterMenu::DTextEnterMenu
          (DTextEnterMenu *this,DMenu *parent,char *textbuffer,int maxlen,int sizemode,bool showgrid
          ,bool allowcolors)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  bool bVar4;
  undefined3 in_register_00000089;
  
  DMenu::DMenu(&this->super_DMenu,parent);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007c01c8;
  this->mEnterString = textbuffer;
  this->mEnterSize = maxlen;
  sVar3 = strlen(textbuffer);
  uVar2 = (uint)sVar3;
  this->mEnterPos = uVar2;
  this->mSizeMode = sizemode;
  if (CONCAT31(in_register_00000089,showgrid) == 0) {
    bVar4 = m_showinputgrid.Value;
  }
  else {
    bVar4 = true;
  }
  this->mInputGridOkay = bVar4;
  iVar1 = 0xc;
  if (uVar2 == 0) {
    iVar1 = 0;
  }
  this->InputGridX = iVar1;
  this->InputGridY = (uint)(uVar2 != 0) << 2;
  this->AllowColors = allowcolors;
  return;
}

Assistant:

DTextEnterMenu::DTextEnterMenu(DMenu *parent, char *textbuffer, int maxlen, int sizemode, bool showgrid, bool allowcolors)
: DMenu(parent)
{
	mEnterString = textbuffer;
	mEnterSize = maxlen;
	mEnterPos = (unsigned)strlen(textbuffer);
	mSizeMode = sizemode;
	mInputGridOkay = showgrid || m_showinputgrid;
	if (mEnterPos > 0)
	{
		InputGridX = INPUTGRID_WIDTH - 1;
		InputGridY = INPUTGRID_HEIGHT - 1;
	}
	else
	{
		// If we are naming a new save, don't start the cursor on "end".
		InputGridX = 0;
		InputGridY = 0;
	}
	AllowColors = allowcolors; // [TP]
}